

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approximate_quantile.cpp
# Opt level: O3

float duckdb::CheckApproxQuantile(Value *quantile_val)

{
  BinderException *pBVar1;
  float fVar2;
  string local_40;
  
  if (quantile_val->is_null == true) {
    pBVar1 = (BinderException *)__cxa_allocate_exception(0x10);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"APPROXIMATE QUANTILE parameter cannot be NULL","");
    BinderException::BinderException(pBVar1,&local_40);
    __cxa_throw(pBVar1,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  fVar2 = Value::GetValue<float>(quantile_val);
  if ((0.0 <= fVar2) && (fVar2 <= 1.0)) {
    return fVar2;
  }
  pBVar1 = (BinderException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"APPROXIMATE QUANTILE can only take parameters in range [0, 1]","")
  ;
  BinderException::BinderException(pBVar1,&local_40);
  __cxa_throw(pBVar1,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static float CheckApproxQuantile(const Value &quantile_val) {
	if (quantile_val.IsNull()) {
		throw BinderException("APPROXIMATE QUANTILE parameter cannot be NULL");
	}
	auto quantile = quantile_val.GetValue<float>();
	if (quantile < 0 || quantile > 1) {
		throw BinderException("APPROXIMATE QUANTILE can only take parameters in range [0, 1]");
	}

	return quantile;
}